

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  size_t sVar8;
  undefined1 *puVar9;
  byte bVar10;
  uint uVar11;
  undefined1 *puVar12;
  int iVar13;
  undefined1 *puVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined4 in_register_0000008c;
  undefined1 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 *puVar22;
  void *pvVar23;
  ulong uVar24;
  bool bVar25;
  BIT_DStream_t local_178;
  BIT_DStream_t local_150;
  BIT_DStream_t local_128;
  BIT_DStream_t local_100;
  ulong local_d8;
  size_t local_d0;
  HUF_DTable *local_c8;
  undefined1 *local_c0;
  size_t *local_b8;
  size_t local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  size_t local_90;
  size_t *local_88;
  size_t *local_80;
  size_t *local_70;
  size_t local_68;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar8 = HUF_decompress4X1_usingDTable_internal_fast
                          (dst,dstSize,cSrc,cSrcSize,DTable,
                           (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar8 != 0)) {
      return sVar8;
    }
    sVar8 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar8;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar21 = (ulong)*cSrc;
  uVar20 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar19 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar7 = uVar21 + uVar20 + uVar19 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar7) {
    return 0xffffffffffffffec;
  }
  local_a8 = (undefined1 *)((long)dst + dstSize);
  local_d8 = dstSize + 3 >> 2;
  local_a0 = (undefined1 *)((long)dst + local_d8);
  puVar12 = local_a0 + local_d8;
  local_c0 = puVar12 + local_d8;
  if (local_a8 < local_c0) {
    return 0xffffffffffffffec;
  }
  uVar4 = *(undefined2 *)((long)DTable + 2);
  local_c8 = DTable;
  local_68 = dstSize;
  sVar8 = BIT_initDStream(&local_100,(void *)((long)cSrc + 6),uVar21);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  pvVar23 = (void *)((long)cSrc + uVar21 + 6);
  sVar8 = BIT_initDStream(&local_128,pvVar23,uVar20);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  pvVar23 = (void *)((long)pvVar23 + uVar20);
  sVar8 = BIT_initDStream(&local_150,pvVar23,uVar19);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  sVar8 = BIT_initDStream(&local_178,(void *)((long)pvVar23 + uVar19),cSrcSize - uVar7);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  puVar9 = (undefined1 *)((long)dst + (local_68 - 3));
  cVar6 = (char)uVar4;
  puVar14 = puVar12;
  puVar18 = local_c0;
  puVar22 = local_a0;
  if (7 < (ulong)((long)local_a8 - (long)local_c0)) {
    local_d0 = local_150.bitContainer;
    local_90 = local_178.bitContainer;
    bVar10 = -cVar6 & 0x3f;
    local_88 = (size_t *)local_100.ptr;
    local_80 = (size_t *)local_128.ptr;
    local_b8 = (size_t *)local_150.ptr;
    lVar5 = local_d8 * 3;
    bVar25 = true;
    while (((undefined1 *)((long)dst + lVar5) < puVar9 && (bVar25))) {
      uVar7 = (local_100.bitContainer << ((byte)local_100.bitsConsumed & 0x3f)) >> bVar10;
      uVar20 = (local_128.bitContainer << ((byte)local_128.bitsConsumed & 0x3f)) >> bVar10;
      uVar21 = (local_d0 << ((byte)local_150.bitsConsumed & 0x3f)) >> bVar10;
      uVar19 = (local_90 << ((byte)local_178.bitsConsumed & 0x3f)) >> bVar10;
      iVar17 = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_100.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      iVar16 = *(byte *)((long)local_c8 + uVar20 * 2 + 4) + local_128.bitsConsumed;
      *(undefined1 *)((long)dst + local_d8) = *(undefined1 *)((long)local_c8 + uVar20 * 2 + 5);
      iVar15 = *(byte *)((long)local_c8 + uVar21 * 2 + 4) + local_150.bitsConsumed;
      *(undefined1 *)((long)dst + local_d8 * 2) = *(undefined1 *)((long)local_c8 + uVar21 * 2 + 5);
      uVar7 = (local_100.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
      uVar20 = (local_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar13 = *(byte *)((long)local_c8 + uVar19 * 2 + 4) + local_178.bitsConsumed;
      uVar24 = (local_d0 << ((byte)iVar15 & 0x3f)) >> bVar10;
      uVar21 = (local_90 << ((byte)iVar13 & 0x3f)) >> bVar10;
      *(undefined1 *)((long)dst + lVar5) = *(undefined1 *)((long)local_c8 + uVar19 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar17;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar20 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + local_d8 + 1) = *(undefined1 *)((long)local_c8 + uVar20 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)local_c8 + uVar24 * 2 + 4) + iVar15;
      *(undefined1 *)((long)dst + local_d8 * 2 + 1) =
           *(undefined1 *)((long)local_c8 + uVar24 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)local_c8 + uVar21 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + lVar5 + 1) = *(undefined1 *)((long)local_c8 + uVar21 * 2 + 5);
      uVar7 = (local_100.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
      uVar19 = (local_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar17 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar17;
      uVar20 = (local_d0 << ((byte)iVar15 & 0x3f)) >> bVar10;
      uVar21 = (local_90 << ((byte)iVar13 & 0x3f)) >> bVar10;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar19 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + local_d8 + 2) = *(undefined1 *)((long)local_c8 + uVar19 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)local_c8 + uVar20 * 2 + 4) + iVar15;
      *(undefined1 *)((long)dst + local_d8 * 2 + 2) =
           *(undefined1 *)((long)local_c8 + uVar20 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)local_c8 + uVar21 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + lVar5 + 2) = *(undefined1 *)((long)local_c8 + uVar21 * 2 + 5);
      uVar7 = (local_100.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
      local_100.bitsConsumed = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar17;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + local_d8 + 3) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_d0 << ((byte)iVar15 & 0x3f)) >> bVar10;
      bVar2 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + local_d8 * 2 + 3) =
           *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_90 << ((byte)iVar13 & 0x3f)) >> bVar10;
      bVar3 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + lVar5 + 3) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      if (local_88 < local_100.limitPtr) {
        iVar17 = 3;
        local_b0 = local_100.bitContainer;
      }
      else {
        local_88 = (size_t *)((long)local_88 - (ulong)(local_100.bitsConsumed >> 3));
        local_100.bitsConsumed = local_100.bitsConsumed & 7;
        local_b0 = *local_88;
        iVar17 = 0;
      }
      local_128.bitsConsumed = iVar16 + (uint)bVar1;
      if (local_80 < local_128.limitPtr) {
        iVar16 = 3;
      }
      else {
        local_80 = (size_t *)((long)local_80 - (ulong)(local_128.bitsConsumed >> 3));
        local_128.bitsConsumed = local_128.bitsConsumed & 7;
        local_128.bitContainer = *local_80;
        iVar16 = 0;
      }
      local_150.bitsConsumed = iVar15 + (uint)bVar2;
      if (local_b8 < local_150.limitPtr) {
        iVar15 = 3;
      }
      else {
        local_b8 = (size_t *)((long)local_b8 - (ulong)(local_150.bitsConsumed >> 3));
        local_150.bitsConsumed = local_150.bitsConsumed & 7;
        local_d0 = *local_b8;
        iVar15 = 0;
      }
      local_178.bitsConsumed = iVar13 + (uint)bVar3;
      if (local_178.ptr < local_178.limitPtr) {
        iVar13 = 3;
        local_70 = (size_t *)local_178.ptr;
      }
      else {
        local_70 = (size_t *)((long)local_178.ptr - (ulong)(local_178.bitsConsumed >> 3));
        local_178.bitsConsumed = local_178.bitsConsumed & 7;
        local_90 = *local_70;
        iVar13 = 0;
      }
      dst = (void *)((long)dst + 4);
      bVar25 = ((iVar16 == 0 && iVar17 == 0) && iVar15 == 0) && iVar13 == 0;
      local_100.bitContainer = local_b0;
      local_178.ptr = (char *)local_70;
    }
    local_100.ptr = (char *)local_88;
    local_128.ptr = (char *)local_80;
    local_150.ptr = (char *)local_b8;
    local_150.bitContainer = local_d0;
    local_178.bitContainer = local_90;
    puVar14 = (undefined1 *)((long)dst + local_d8 * 2);
    puVar18 = (undefined1 *)((long)dst + lVar5);
    puVar22 = (undefined1 *)((long)dst + local_d8);
  }
  if (local_c0 < puVar14 || (puVar12 < puVar22 || local_a0 < dst)) {
    return 0xffffffffffffffec;
  }
  if ((long)local_a0 - (long)dst < 4) {
    if (local_100.bitsConsumed < 0x41) {
      if (local_100.ptr < local_100.limitPtr) {
        if (local_100.ptr == local_100.start) goto LAB_001a20fe;
        uVar11 = (int)local_100.ptr - (int)local_100.start;
        if (local_100.start <=
            (size_t *)((long)local_100.ptr - (ulong)(local_100.bitsConsumed >> 3))) {
          uVar11 = local_100.bitsConsumed >> 3;
        }
        local_100.bitsConsumed = local_100.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_100.bitsConsumed >> 3;
        local_100.bitsConsumed = local_100.bitsConsumed & 7;
      }
      local_100.ptr = (char *)((long)local_100.ptr - (ulong)uVar11);
      local_100.bitContainer = *(size_t *)local_100.ptr;
    }
  }
  else {
    bVar10 = -cVar6 & 0x3f;
    while (local_100.bitsConsumed < 0x41) {
      if (local_100.ptr < local_100.limitPtr) {
        if (local_100.ptr == local_100.start) break;
        bVar25 = local_100.start <=
                 (size_t *)((long)local_100.ptr - (ulong)(local_100.bitsConsumed >> 3));
        uVar7 = (ulong)(uint)((int)local_100.ptr - (int)local_100.start);
        if (bVar25) {
          uVar7 = (ulong)(local_100.bitsConsumed >> 3);
        }
        local_100.bitsConsumed = local_100.bitsConsumed + (int)uVar7 * -8;
      }
      else {
        uVar7 = (ulong)(local_100.bitsConsumed >> 3);
        local_100.bitsConsumed = local_100.bitsConsumed & 7;
        bVar25 = true;
      }
      local_100.ptr = (char *)((long)local_100.ptr - uVar7);
      local_100.bitContainer = *(size_t *)local_100.ptr;
      if ((local_a0 + -3 <= dst) || (!bVar25)) break;
      uVar7 = (local_100.bitContainer << ((byte)local_100.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_100.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_100.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_100.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_100.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      dst = (void *)((long)dst + 4);
      local_100.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a20fe:
  bVar10 = -cVar6 & 0x3f;
  for (; dst < local_a0; dst = (void *)((long)dst + 1)) {
    uVar7 = (local_100.bitContainer << ((byte)local_100.bitsConsumed & 0x3f)) >> bVar10;
    local_100.bitsConsumed = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_100.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
  }
  if ((long)puVar12 - (long)puVar22 < 4) {
    if (local_128.bitsConsumed < 0x41) {
      if (local_128.ptr < local_128.limitPtr) {
        if (local_128.ptr == local_128.start) goto LAB_001a2357;
        uVar11 = (int)local_128.ptr - (int)local_128.start;
        if (local_128.start <=
            (size_t *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
          uVar11 = local_128.bitsConsumed >> 3;
        }
        local_128.bitsConsumed = local_128.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_128.bitsConsumed >> 3;
        local_128.bitsConsumed = local_128.bitsConsumed & 7;
      }
      local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar11);
      local_128.bitContainer = *(size_t *)local_128.ptr;
    }
  }
  else {
    while (local_128.bitsConsumed < 0x41) {
      if (local_128.ptr < local_128.limitPtr) {
        if (local_128.ptr == local_128.start) break;
        bVar25 = local_128.start <=
                 (size_t *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3));
        uVar11 = (int)local_128.ptr - (int)local_128.start;
        if (bVar25) {
          uVar11 = local_128.bitsConsumed >> 3;
        }
        local_128.bitsConsumed = local_128.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_128.bitsConsumed >> 3;
        local_128.bitsConsumed = local_128.bitsConsumed & 7;
        bVar25 = true;
      }
      local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar11);
      local_128.bitContainer = *(size_t *)local_128.ptr;
      if ((puVar12 + -3 <= puVar22) || (!bVar25)) break;
      uVar7 = (local_128.bitContainer << ((byte)local_128.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_128.bitsConsumed;
      *puVar22 = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      puVar22[1] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      puVar22[2] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      puVar22[3] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      puVar22 = puVar22 + 4;
      local_128.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a2357:
  for (; puVar22 < puVar12; puVar22 = puVar22 + 1) {
    uVar7 = (local_128.bitContainer << ((byte)local_128.bitsConsumed & 0x3f)) >> bVar10;
    local_128.bitsConsumed = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_128.bitsConsumed;
    *puVar22 = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
  }
  if ((long)local_c0 - (long)puVar14 < 4) {
    if (local_150.bitsConsumed < 0x41) {
      if (local_150.ptr < local_150.limitPtr) {
        if (local_150.ptr == local_150.start) goto LAB_001a2532;
        uVar11 = (int)local_150.ptr - (int)local_150.start;
        if (local_150.start <=
            (size_t *)((long)local_150.ptr - (ulong)(local_150.bitsConsumed >> 3))) {
          uVar11 = local_150.bitsConsumed >> 3;
        }
        local_150.bitsConsumed = local_150.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_150.bitsConsumed >> 3;
        local_150.bitsConsumed = local_150.bitsConsumed & 7;
      }
      local_150.ptr = (char *)((long)local_150.ptr - (ulong)uVar11);
      local_150.bitContainer = *(size_t *)local_150.ptr;
    }
  }
  else {
    while (local_150.bitsConsumed < 0x41) {
      if (local_150.ptr < local_150.limitPtr) {
        if (local_150.ptr == local_150.start) break;
        bVar25 = local_150.start <=
                 (size_t *)((long)local_150.ptr - (ulong)(local_150.bitsConsumed >> 3));
        uVar11 = (int)local_150.ptr - (int)local_150.start;
        if (bVar25) {
          uVar11 = local_150.bitsConsumed >> 3;
        }
        local_150.bitsConsumed = local_150.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_150.bitsConsumed >> 3;
        local_150.bitsConsumed = local_150.bitsConsumed & 7;
        bVar25 = true;
      }
      local_150.ptr = (char *)((long)local_150.ptr - (ulong)uVar11);
      local_150.bitContainer = *(size_t *)local_150.ptr;
      if ((local_c0 + -3 <= puVar14) || (!bVar25)) break;
      uVar7 = (local_150.bitContainer << ((byte)local_150.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_150.bitsConsumed;
      *puVar14 = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_150.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      puVar14[1] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_150.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      puVar14[2] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_150.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      puVar14[3] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      puVar14 = puVar14 + 4;
      local_150.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a2532:
  for (; puVar14 < local_c0; puVar14 = puVar14 + 1) {
    uVar7 = (local_150.bitContainer << ((byte)local_150.bitsConsumed & 0x3f)) >> bVar10;
    local_150.bitsConsumed = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_150.bitsConsumed;
    *puVar14 = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
  }
  if ((long)local_a8 - (long)puVar18 < 4) {
    if (local_178.bitsConsumed < 0x41) {
      if (local_178.ptr < local_178.limitPtr) {
        if (local_178.ptr == local_178.start) goto LAB_001a2704;
        uVar11 = (int)local_178.ptr - (int)local_178.start;
        if (local_178.start <=
            (size_t *)((long)local_178.ptr - (ulong)(local_178.bitsConsumed >> 3))) {
          uVar11 = local_178.bitsConsumed >> 3;
        }
        local_178.bitsConsumed = local_178.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_178.bitsConsumed >> 3;
        local_178.bitsConsumed = local_178.bitsConsumed & 7;
      }
      local_178.ptr = (char *)((long)local_178.ptr - (ulong)uVar11);
      local_178.bitContainer = *(size_t *)local_178.ptr;
    }
  }
  else {
    while (local_178.bitsConsumed < 0x41) {
      if (local_178.ptr < local_178.limitPtr) {
        if (local_178.ptr == local_178.start) break;
        bVar25 = local_178.start <=
                 (size_t *)((long)local_178.ptr - (ulong)(local_178.bitsConsumed >> 3));
        uVar11 = (int)local_178.ptr - (int)local_178.start;
        if (bVar25) {
          uVar11 = local_178.bitsConsumed >> 3;
        }
        local_178.bitsConsumed = local_178.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = local_178.bitsConsumed >> 3;
        local_178.bitsConsumed = local_178.bitsConsumed & 7;
        bVar25 = true;
      }
      local_178.ptr = (char *)((long)local_178.ptr - (ulong)uVar11);
      local_178.bitContainer = *(size_t *)local_178.ptr;
      if ((puVar9 <= puVar18) || (!bVar25)) break;
      uVar7 = (local_178.bitContainer << ((byte)local_178.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_178.bitsConsumed;
      *puVar18 = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_178.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      puVar18[1] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_178.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)local_c8 + uVar7 * 2 + 4) + iVar16;
      puVar18[2] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      uVar7 = (local_178.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)local_c8 + uVar7 * 2 + 4);
      puVar18[3] = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
      puVar18 = puVar18 + 4;
      local_178.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a2704:
  for (; puVar18 < local_a8; puVar18 = puVar18 + 1) {
    uVar7 = (local_178.bitContainer << ((byte)local_178.bitsConsumed & 0x3f)) >> bVar10;
    local_178.bitsConsumed = *(byte *)((long)local_c8 + uVar7 * 2 + 4) + local_178.bitsConsumed;
    *puVar18 = *(undefined1 *)((long)local_c8 + uVar7 * 2 + 5);
  }
  sVar8 = 0xffffffffffffffec;
  if (local_178.bitsConsumed != 0x40) {
    local_68 = sVar8;
  }
  if (local_178.ptr != local_178.start) {
    local_68 = sVar8;
  }
  if (local_150.bitsConsumed != 0x40) {
    local_68 = sVar8;
  }
  if (local_150.ptr != local_150.start) {
    local_68 = sVar8;
  }
  if (local_128.bitsConsumed != 0x40) {
    local_68 = sVar8;
  }
  if (local_128.ptr != local_128.start) {
    local_68 = sVar8;
  }
  if (local_100.bitsConsumed != 0x40) {
    local_68 = sVar8;
  }
  if (local_100.ptr != local_100.start) {
    return 0xffffffffffffffec;
  }
  return local_68;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}